

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimization.cc
# Opt level: O2

void re2c::minimization(dfa_t *dfa)

{
  size_t sVar1;
  dfa_state_t *pdVar2;
  ulong uVar3;
  mapped_type mVar4;
  size_t *psVar5;
  int iVar6;
  size_t i_1;
  ulong uVar7;
  void *pvVar8;
  opt_t *poVar9;
  undefined8 *puVar10;
  void *pvVar11;
  mapped_type *pmVar12;
  void *pvVar13;
  void *pvVar14;
  bool bVar15;
  size_t i;
  ulong uVar16;
  long lVar17;
  size_t j;
  ulong uVar18;
  size_t i_3;
  ulong uVar19;
  size_t j_1;
  ulong uVar20;
  undefined8 uVar21;
  size_t k;
  size_t sVar22;
  ulong uVar23;
  pointer ppdVar24;
  ulong uVar25;
  size_type __new_size;
  ulong uVar26;
  size_t i_5;
  bool bVar27;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>,_bool>
  pVar28;
  pair<re2c::RuleOp_*,_bool> key;
  pair<std::pair<re2c::RuleOp_*,_bool>,_unsigned_long> local_a8;
  ulong local_88;
  pointer local_80;
  ulong local_78;
  ulong local_70;
  size_t local_68;
  map<std::pair<re2c::RuleOp_*,_bool>,_unsigned_long,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
  init;
  
  uVar7 = (long)(dfa->states).
                super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(dfa->states).
                super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  uVar16 = (long)uVar7 >> 3;
  uVar7 = -(ulong)(uVar16 >> 0x3d != 0) | uVar7;
  pvVar8 = operator_new__(uVar7);
  poVar9 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (poVar9->dfa_minimization == DFA_MINIMIZATION_MOORE) {
    sVar1 = dfa->nchars;
    uVar20 = (long)(dfa->states).
                   super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(dfa->states).
                   super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar19 = (long)uVar20 >> 3;
    if (0x1fffffffffffffff < uVar19) {
      uVar20 = 0xffffffffffffffff;
    }
    local_88 = uVar7;
    pvVar11 = operator_new__(uVar20);
    init._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &init._M_t._M_impl.super__Rb_tree_header._M_header;
    init._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    init._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    init._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    init._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         init._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
      pdVar2 = (dfa->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar7];
      key.first = pdVar2->rule;
      key.second = pdVar2->ctx;
      local_a8.first._9_4_ = key._9_4_;
      local_a8.first._13_2_ = key._13_2_;
      local_a8.first._15_1_ = key._15_1_;
      local_a8.first.first = key.first;
      local_a8.first.second = key.second;
      local_a8.second = uVar7;
      pVar28 = std::
               _Rb_tree<std::pair<re2c::RuleOp*,bool>,std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>,std::_Select1st<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>,std::less<std::pair<re2c::RuleOp*,bool>>,std::allocator<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>>
               ::_M_emplace_unique<std::pair<std::pair<re2c::RuleOp*,bool>,unsigned_long>>
                         ((_Rb_tree<std::pair<re2c::RuleOp*,bool>,std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>,std::_Select1st<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>,std::less<std::pair<re2c::RuleOp*,bool>>,std::allocator<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>>
                           *)&init,&local_a8);
      if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pmVar12 = std::
                  map<std::pair<re2c::RuleOp_*,_bool>,_unsigned_long,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
                  ::operator[](&init,&key);
        mVar4 = *pmVar12;
        *(mapped_type *)((long)pvVar8 + uVar7 * 8) = mVar4;
        *(undefined8 *)((long)pvVar11 + uVar7 * 8) = *(undefined8 *)((long)pvVar11 + mVar4 * 8);
        *(ulong *)((long)pvVar11 + mVar4 * 8) = uVar7;
      }
      else {
        *(ulong *)((long)pvVar8 + uVar7 * 8) = uVar7;
        *(undefined8 *)((long)pvVar11 + uVar7 * 8) = 0xffffffffffffffff;
      }
    }
    uVar7 = uVar19 * sVar1 * 8;
    if (0x1fffffffffffffff < uVar19 * sVar1) {
      uVar7 = 0xffffffffffffffff;
    }
    pvVar13 = operator_new__(uVar7);
    pvVar14 = operator_new__(uVar20);
    local_68 = sVar1 * 8;
    ppdVar24 = (dfa->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar20 = 0;
    local_80 = ppdVar24;
    do {
      for (; uVar7 < uVar19; uVar7 = uVar7 + 1) {
        if ((uVar7 == *(ulong *)((long)pvVar8 + uVar7 * 8)) &&
           (uVar18 = uVar7, *(long *)((long)pvVar11 + uVar7 * 8) != -1)) {
          for (; uVar18 != 0xffffffffffffffff; uVar18 = *(ulong *)((long)pvVar11 + uVar18 * 8)) {
            psVar5 = ppdVar24[uVar18]->arcs;
            for (sVar22 = 0; sVar1 != sVar22; sVar22 = sVar22 + 1) {
              uVar21 = 0xffffffffffffffff;
              if (psVar5[sVar22] != 0xffffffffffffffff) {
                uVar21 = *(undefined8 *)((long)pvVar8 + psVar5[sVar22] * 8);
              }
              *(undefined8 *)((long)pvVar13 + sVar22 * 8 + uVar18 * sVar1 * 8) = uVar21;
            }
          }
          uVar18 = 0;
          local_78 = uVar20;
          local_70 = uVar7;
LAB_001395a0:
          if (uVar7 != 0xffffffffffffffff) {
            uVar20 = *(ulong *)((long)pvVar11 + uVar7 * 8);
            uVar26 = 0;
            do {
              if (uVar18 == uVar26) {
                *(ulong *)((long)pvVar14 + uVar18 * 8) = uVar7;
                uVar18 = uVar18 + 1;
                *(ulong *)((long)pvVar8 + uVar7 * 8) = uVar7;
                *(undefined8 *)((long)pvVar11 + uVar7 * 8) = 0xffffffffffffffff;
                uVar7 = uVar20;
                goto LAB_001395a0;
              }
              lVar17 = *(long *)((long)pvVar14 + uVar26 * 8);
              iVar6 = bcmp((void *)((long)pvVar13 + uVar7 * sVar1 * 8),
                           (void *)((long)pvVar13 + lVar17 * sVar1 * 8),local_68);
              uVar26 = uVar26 + 1;
            } while (iVar6 != 0);
            *(long *)((long)pvVar8 + uVar7 * 8) = lVar17;
            *(undefined8 *)((long)pvVar11 + uVar7 * 8) = *(undefined8 *)((long)pvVar11 + lVar17 * 8)
            ;
            *(ulong *)((long)pvVar11 + lVar17 * 8) = uVar7;
            uVar7 = uVar20;
            goto LAB_001395a0;
          }
          uVar20 = CONCAT71((int7)(local_78 >> 8),(byte)local_78 | 1 < uVar18);
          ppdVar24 = local_80;
          uVar7 = local_70;
        }
      }
      uVar7 = 0;
      uVar18 = uVar20 & 1;
      uVar20 = 0;
    } while (uVar18 != 0);
    operator_delete__(pvVar13);
    operator_delete__(pvVar14);
    operator_delete__(pvVar11);
    std::
    _Rb_tree<std::pair<re2c::RuleOp_*,_bool>,_std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>,_std::_Select1st<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
    ::~_Rb_tree(&init._M_t);
    uVar7 = local_88;
  }
  else if (poVar9->dfa_minimization == DFA_MINIMIZATION_TABLE) {
    sVar1 = dfa->nchars;
    ppdVar24 = (dfa->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    uVar20 = (long)(dfa->states).
                   super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)ppdVar24;
    uVar19 = (long)uVar20 >> 3;
    if (0x1fffffffffffffff < uVar19) {
      uVar20 = 0xffffffffffffffff;
    }
    puVar10 = (undefined8 *)operator_new__(uVar20);
    pvVar11 = operator_new__((uVar19 - 1) * uVar19 >> 1);
    *puVar10 = pvVar11;
    for (lVar17 = 0; uVar19 - 1 != lVar17; lVar17 = lVar17 + 1) {
      pvVar11 = (void *)((long)pvVar11 + lVar17);
      puVar10[lVar17 + 1] = pvVar11;
    }
    for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
      pdVar2 = ppdVar24[uVar20];
      for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
        bVar27 = true;
        if (pdVar2->ctx == ppdVar24[uVar18]->ctx) {
          bVar27 = pdVar2->rule != ppdVar24[uVar18]->rule;
        }
        *(bool *)(puVar10[uVar20] + uVar18) = bVar27;
      }
    }
    uVar20 = 0;
    bVar27 = false;
    do {
      for (; bVar15 = bVar27, uVar20 < uVar19; uVar20 = uVar20 + 1) {
        for (uVar18 = 0; uVar18 != uVar20; uVar18 = uVar18 + 1) {
          if (*(char *)(puVar10[uVar20] + uVar18) == '\0') {
            for (sVar22 = 0; sVar1 != sVar22; sVar22 = sVar22 + 1) {
              uVar26 = ppdVar24[uVar20]->arcs[sVar22];
              uVar3 = ppdVar24[uVar18]->arcs[sVar22];
              uVar25 = uVar3;
              if (uVar26 >= uVar3 && uVar26 != uVar3) {
                uVar25 = uVar26;
              }
              uVar23 = uVar3;
              if (uVar26 < uVar3) {
                uVar23 = uVar26;
              }
              if ((uVar26 != uVar3) &&
                 (((uVar25 == 0xffffffffffffffff || (uVar23 == 0xffffffffffffffff)) ||
                  (*(char *)(puVar10[uVar25] + uVar23) == '\x01')))) {
                *(undefined1 *)(puVar10[uVar20] + uVar18) = 1;
                bVar15 = true;
                break;
              }
            }
          }
        }
        bVar27 = bVar15;
      }
      uVar20 = 0;
      bVar27 = false;
    } while (bVar15);
    for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
      *(ulong *)((long)pvVar8 + uVar20 * 8) = uVar20;
      for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
        if (*(char *)(puVar10[uVar20] + uVar18) == '\0') {
          *(ulong *)((long)pvVar8 + uVar20 * 8) = uVar18;
          break;
        }
      }
    }
    if ((void *)*puVar10 != (void *)0x0) {
      operator_delete__((void *)*puVar10);
    }
    operator_delete__(puVar10);
  }
  pvVar11 = operator_new__(uVar7);
  lVar17 = 0;
  for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
    if (uVar7 == *(ulong *)((long)pvVar8 + uVar7 * 8)) {
      *(long *)((long)pvVar11 + uVar7 * 8) = lVar17;
      lVar17 = lVar17 + 1;
    }
  }
  __new_size = 0;
  for (uVar7 = 0; uVar7 != uVar16; uVar7 = uVar7 + 1) {
    ppdVar24 = (dfa->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    pdVar2 = ppdVar24[uVar7];
    if (uVar7 == *(ulong *)((long)pvVar8 + uVar7 * 8)) {
      psVar5 = pdVar2->arcs;
      for (uVar20 = 0; uVar20 < dfa->nchars; uVar20 = uVar20 + 1) {
        sVar1 = psVar5[uVar20];
        if (sVar1 != 0xffffffffffffffff) {
          psVar5[uVar20] = *(size_t *)((long)pvVar11 + *(long *)((long)pvVar8 + sVar1 * 8) * 8);
        }
      }
      ppdVar24[__new_size] = pdVar2;
      __new_size = __new_size + 1;
    }
    else {
      if (pdVar2 != (dfa_state_t *)0x0) {
        dfa_state_t::~dfa_state_t(pdVar2);
      }
      operator_delete(pdVar2,0x18);
    }
  }
  std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::resize
            (&dfa->states,__new_size);
  operator_delete__(pvVar11);
  operator_delete__(pvVar8);
  return;
}

Assistant:

void minimization(dfa_t &dfa)
{
	const size_t count = dfa.states.size();

	size_t *part = new size_t[count];

	switch (opts->dfa_minimization)
	{
		case DFA_MINIMIZATION_TABLE:
			minimization_table(part, dfa.states, dfa.nchars);
			break;
		case DFA_MINIMIZATION_MOORE:
			minimization_moore(part, dfa.states, dfa.nchars);
			break;
	}

	size_t *compact = new size_t[count];
	for (size_t i = 0, j = 0; i < count; ++i)
	{
		if (i == part[i])
		{
			compact[i] = j++;
		}
	}

	size_t new_count = 0;
	for (size_t i = 0; i < count; ++i)
	{
		dfa_state_t *s = dfa.states[i];
		if (i == part[i])
		{
			size_t *arcs = s->arcs;
			for (size_t c = 0; c < dfa.nchars; ++c)
			{
				if (arcs[c] != dfa_t::NIL)
				{
					arcs[c] = compact[part[arcs[c]]];
				}
			}
			dfa.states[new_count++] = s;
		}
		else
		{
			delete s;
		}
	}
	dfa.states.resize(new_count);

	delete[] compact;
	delete[] part;
}